

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-strtod.cc
# Opt level: O2

void TestRandomStrtof(void)

{
  bool bVar1;
  uint32_t uVar2;
  undefined1 uVar3;
  int length;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  int i_1;
  int i;
  int iVar7;
  float fVar8;
  Vector<const_char> buffer_00;
  Vector<const_char> buffer_01;
  Vector<const_char> buffer_02;
  Vector<const_char> buffer_03;
  char buffer [1024];
  
  for (uVar4 = 1; uVar4 != 0xf; uVar4 = uVar4 + 1) {
    for (iVar7 = 0; iVar7 != 2; iVar7 = iVar7 + 1) {
      uVar6 = 0;
      while( true ) {
        uVar2 = DeterministicRandom();
        if (uVar4 == uVar6) break;
        buffer[uVar6] = (byte)((ulong)uVar2 % 10) | 0x30;
        uVar6 = uVar6 + 1;
      }
      uVar3 = 0xb;
      iVar5 = (uVar2 % 0xb - (int)uVar4) + -5;
      buffer[uVar4 & 0xffffffff] = '\0';
      buffer_00.start_ = uVar4 & 0xffffffff;
      buffer_00.length_ = iVar5;
      buffer_00._12_4_ = 0;
      fVar8 = double_conversion::Strtof((double_conversion *)buffer,buffer_00,0xb);
      buffer_02._8_8_ = uVar4 & 0xffffffff;
      buffer_02.start_ = buffer;
      bVar1 = CheckFloat(buffer_02,iVar5,fVar8);
      CheckHelper((char *)0x40b,0xc220bf,(char *)(ulong)bVar1,(bool)uVar3);
    }
  }
  for (uVar4 = 0xf; uVar4 < 800; uVar4 = uVar4 + 2) {
    for (iVar7 = 0; iVar7 != 2; iVar7 = iVar7 + 1) {
      uVar6 = 0;
      while( true ) {
        uVar2 = DeterministicRandom();
        if (uVar4 == uVar6) break;
        buffer[uVar6] = (byte)((ulong)uVar2 % 10) | 0x30;
        uVar6 = uVar6 + 1;
      }
      uVar3 = 0x4d;
      iVar5 = (uVar2 % 0x4d - (int)uVar4) + -0x26;
      buffer[uVar4] = '\0';
      buffer_01.start_ = uVar4 & 0xffffffff;
      buffer_01.length_ = iVar5;
      buffer_01._12_4_ = 0;
      fVar8 = double_conversion::Strtof((double_conversion *)buffer,buffer_01,0x4d);
      buffer_03._8_8_ = uVar4 & 0xffffffff;
      buffer_03.start_ = buffer;
      bVar1 = CheckFloat(buffer_03,iVar5,fVar8);
      CheckHelper((char *)0x418,0xc220bf,(char *)(ulong)bVar1,(bool)uVar3);
    }
  }
  return;
}

Assistant:

TEST(RandomStrtof) {
  char buffer[kBufferSize];
  for (int length = 1; length < 15; length++) {
    for (int i = 0; i < kShortStrtofRandomCount; ++i) {
      int pos = 0;
      for (int j = 0; j < length; ++j) {
        buffer[pos++] = DeterministicRandom() % 10 + '0';
      }
      int exponent = DeterministicRandom() % (5*2 + 1) - 5 - length;
      buffer[pos] = '\0';
      Vector<const char> vector(buffer, pos);
      float strtof_result = Strtof(vector, exponent);
      CHECK(CheckFloat(vector, exponent, strtof_result));
    }
  }
  for (int length = 15; length < 800; length += 2) {
    for (int i = 0; i < kLargeStrtofRandomCount; ++i) {
      int pos = 0;
      for (int j = 0; j < length; ++j) {
        buffer[pos++] = DeterministicRandom() % 10 + '0';
      }
      int exponent = DeterministicRandom() % (38*2 + 1) - 38 - length;
      buffer[pos] = '\0';
      Vector<const char> vector(buffer, pos);
      float strtof_result = Strtof(vector, exponent);
      CHECK(CheckFloat(vector, exponent, strtof_result));
    }
  }
}